

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

ps_seg_t * ps_lattice_seg_iter(ps_lattice_t *dag,ps_latlink_t *link,float32 lwf)

{
  short sVar1;
  ps_seg_t *seg;
  ps_segfuncs_t *ppVar2;
  long lVar3;
  ps_latlink_s *ppVar4;
  
  seg = (ps_seg_t *)
        __ckd_calloc__(1,0x48,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                       ,0x3f8);
  seg->vt = &ps_lattice_segfuncs;
  seg->search = dag->search;
  seg->lwf = lwf;
  *(undefined2 *)((long)&seg[1].search + 4) = 0;
  *(int32 *)&seg[1].search = dag->norm;
  if (link != (ps_latlink_t *)0x0) {
    sVar1 = 0;
    ppVar4 = link;
    do {
      ppVar4 = ppVar4->best_prev;
      sVar1 = sVar1 + -1;
    } while (ppVar4 != (ps_latlink_s *)0x0);
    *(short *)((long)&seg[1].search + 4) = -sVar1;
    if (sVar1 != 0) {
      ppVar2 = (ps_segfuncs_t *)
               __ckd_calloc__((long)-sVar1,8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                              ,0x407);
      seg[1].vt = ppVar2;
      if (link != (ps_latlink_t *)0x0) {
        lVar3 = (long)*(short *)((long)&seg[1].search + 4) * 8;
        do {
          lVar3 = lVar3 + -8;
          *(ps_latlink_t **)((long)seg[1].vt + lVar3) = link;
          link = link->best_prev;
        } while (link != (ps_latlink_s *)0x0);
        ppVar2 = seg[1].vt;
      }
      ps_lattice_link2itor(seg,(ps_latlink_t *)ppVar2->seg_next,0);
      return seg;
    }
  }
  ckd_free(seg);
  return (ps_seg_t *)0x0;
}

Assistant:

ps_seg_t *
ps_lattice_seg_iter(ps_lattice_t *dag, ps_latlink_t *link, float32 lwf)
{
    dag_seg_t *itor;
    ps_latlink_t *l;
    int cur;

    /* Calling this an "iterator" is a bit of a misnomer since we have
     * to get the entire backtrace in order to produce it.
     */
    itor = ckd_calloc(1, sizeof(*itor));
    itor->base.vt = &ps_lattice_segfuncs;
    itor->base.search = dag->search;
    itor->base.lwf = lwf;
    itor->n_links = 0;
    itor->norm = dag->norm;

    for (l = link; l; l = l->best_prev) {
        ++itor->n_links;
    }
    if (itor->n_links == 0) {
        ckd_free(itor);
        return NULL;
    }

    itor->links = ckd_calloc(itor->n_links, sizeof(*itor->links));
    cur = itor->n_links - 1;
    for (l = link; l; l = l->best_prev) {
        itor->links[cur] = l;
        --cur;
    }

    ps_lattice_link2itor((ps_seg_t *)itor, itor->links[0], FALSE);
    return (ps_seg_t *)itor;
}